

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

int formparse(OperationConfig *config,char *input,curl_mime **mimepost,curl_mime **mimecurrent,
             _Bool literal_value)

{
  char *__s1;
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CURLcode CVar5;
  curl_mime *pcVar6;
  char *pcVar7;
  curl_mimepart *part;
  char *pcVar8;
  char *local_78;
  curl_slist *headers;
  curl_mime **local_68;
  char *type;
  char *data;
  char *contp;
  char *encoder;
  char *local_40;
  char *filename;
  
  type = (char *)0x0;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  headers = (curl_slist *)0x0;
  if (*mimepost == (curl_mime *)0x0) {
    pcVar6 = (curl_mime *)curl_mime_init(config->easy);
    *mimepost = pcVar6;
    if (pcVar6 == (curl_mime *)0x0) {
      warnf(config->global,"curl_mime_init failed!\n");
      return 1;
    }
    *mimecurrent = pcVar6;
  }
  local_78 = strdup(input);
  if (local_78 == (char *)0x0) {
    curl_mfprintf(config->global->errors,"out of memory\n");
    return 2;
  }
  pcVar7 = strchr(local_78,0x3d);
  if (pcVar7 == (char *)0x0) {
    contp = pcVar7;
    warnf(config->global,"Illegally formatted input field!\n");
    free(local_78);
    return 0x20;
  }
  pcVar8 = (char *)0x0;
  if (local_78 < pcVar7) {
    pcVar8 = local_78;
  }
  __s1 = pcVar7 + 1;
  *pcVar7 = '\0';
  cVar1 = pcVar7[1];
  local_68 = mimecurrent;
  contp = __s1;
  if (cVar1 == '(' && !literal_value) {
    part = (curl_mimepart *)0x0;
    iVar3 = get_param_part(config,'\0',&contp,&data,&type,(char **)0x0,(char **)0x0,&headers);
    if (iVar3 < 0) {
      mimepost = (curl_mime **)0x3;
LAB_0010dd2f:
      free(local_78);
      local_78 = (char *)0x0;
      bVar2 = false;
    }
    else {
      pcVar6 = (curl_mime *)curl_mime_init(config->easy);
      if (pcVar6 == (curl_mime *)0x0) {
        part = (curl_mimepart *)0x0;
        warnf(config->global,"curl_mime_init failed!\n");
        curl_slist_free_all(headers);
        mimepost = (curl_mime **)0x4;
        goto LAB_0010dd2f;
      }
      part = (curl_mimepart *)curl_mime_addpart(*local_68);
      if (part == (curl_mimepart *)0x0) {
        part = (curl_mimepart *)0x0;
        warnf(config->global,"curl_mime_addpart failed!\n");
        curl_mime_free(pcVar6);
        curl_slist_free_all(headers);
        mimepost = (curl_mime **)0x5;
        goto LAB_0010dd2f;
      }
      iVar3 = curl_mime_subparts(part,pcVar6);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_subparts failed!\n");
        curl_mime_free(pcVar6);
        curl_slist_free_all(headers);
        mimepost = (curl_mime **)0x6;
        goto LAB_0010dd2f;
      }
      *local_68 = pcVar6;
      iVar3 = curl_mime_headers(part,headers,1);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        mimepost = (curl_mime **)0x7;
        goto LAB_0010dd2f;
      }
      iVar3 = curl_mime_type(part,type);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_type failed!\n");
        mimepost = (curl_mime **)0x8;
        goto LAB_0010dd2f;
      }
      bVar2 = true;
    }
    iVar3 = (int)mimepost;
  }
  else {
    local_40 = pcVar8;
    if ((pcVar8 == (char *)0x0) && (iVar3 = strcmp(__s1,")"), iVar3 == 0 && !literal_value)) {
      if (*local_68 == *mimepost) {
        warnf(config->global,"no multipart to terminate!\n");
        free(local_78);
        return 9;
      }
      *local_68 = (*local_68)->parent->parent;
      part = (curl_mimepart *)0x0;
      pcVar8 = local_40;
      goto LAB_0010ddb7;
    }
    if (cVar1 != '@' || literal_value) {
      part = (curl_mimepart *)curl_mime_addpart(*local_68);
      if (part == (curl_mimepart *)0x0) {
        warnf(config->global,"curl_mime_addpart failed!\n");
        free(local_78);
        return 0x14;
      }
      if (*__s1 == '<' && !literal_value) {
        contp = pcVar7 + 2;
        iVar3 = get_param_part(config,'\0',&contp,&data,&type,(char **)0x0,&encoder,&headers);
        if (iVar3 < 0) {
          free(local_78);
          return 0x15;
        }
        iVar4 = curl_mime_headers(part,headers,1);
        pcVar7 = data;
        if (iVar4 != 0) {
          warnf(config->global,"curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          free(local_78);
          return 0x16;
        }
        CVar5 = file_or_stdin(part,data);
        if ((CVar5 != CURLE_OK) &&
           (warnf(config->global,"setting file %s failed!\n",pcVar7), CVar5 != CURLE_READ_ERROR)) {
          free(local_78);
          return 0x17;
        }
      }
      else {
        if (literal_value) {
          iVar3 = 0;
          data = __s1;
        }
        else {
          iVar3 = get_param_part(config,'\0',&contp,&data,&type,&filename,&encoder,&headers);
          if (iVar3 < 0) {
            free(local_78);
            return 0x18;
          }
        }
        iVar4 = curl_mime_headers(part,headers,1);
        if (iVar4 != 0) {
          warnf(config->global,"curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          free(local_78);
          return 0x19;
        }
        iVar4 = curl_mime_data(part,data,0xffffffffffffffff);
        if (iVar4 != 0) {
          warnf(config->global,"curl_mime_data failed!\n");
          free(local_78);
          return 0x1b;
        }
      }
      iVar4 = curl_mime_filename(part,filename);
      if (iVar4 != 0) {
        warnf(config->global,"curl_mime_filename failed!\n");
        free(local_78);
        return 0x1c;
      }
      iVar4 = curl_mime_type(part,type);
      if (iVar4 != 0) {
        warnf(config->global,"curl_mime_type failed!\n");
        free(local_78);
        return 0x1d;
      }
      iVar4 = curl_mime_encoder(part,encoder);
      if (iVar4 != 0) {
        warnf(config->global,"curl_mime_encoder failed!\n");
        free(local_78);
        return 0x1e;
      }
      pcVar8 = local_40;
      if (iVar3 != 0) {
        *contp = (char)iVar3;
        warnf(config->global,"garbage at end of field specification: %s\n");
        pcVar8 = local_40;
      }
      goto LAB_0010ddb7;
    }
    part = (curl_mimepart *)0x0;
    pcVar6 = (curl_mime *)0x0;
    do {
      contp = contp + 1;
      iVar3 = get_param_part(config,',',&contp,&data,&type,&filename,&encoder,&headers);
      if (iVar3 < 0) {
        iVar3 = 10;
        goto LAB_0010dd89;
      }
      if (pcVar6 == (curl_mime *)0x0) {
        if (iVar3 == 0x2c) {
          pcVar6 = (curl_mime *)curl_mime_init(config->easy);
          if (pcVar6 == (curl_mime *)0x0) {
            warnf(config->global,"curl_mime_init failed!\n");
            curl_slist_free_all(headers);
            iVar3 = 0xb;
            goto LAB_0010dd9b;
          }
        }
        else {
          pcVar6 = *local_68;
        }
      }
      part = (curl_mimepart *)curl_mime_addpart(pcVar6);
      if (part == (curl_mimepart *)0x0) {
        warnf(config->global,"curl_mime_addpart failed!\n");
        if (pcVar6 != *local_68) {
          curl_mime_free(pcVar6);
        }
        curl_slist_free_all(headers);
        iVar3 = 0xc;
        part = (curl_mimepart *)0x0;
        goto LAB_0010dd9b;
      }
      iVar4 = curl_mime_headers(part,headers,1);
      pcVar7 = data;
      if (iVar4 != 0) {
        warnf(config->global,"curl_mime_headers failed!\n");
        if (pcVar6 != *local_68) {
          curl_mime_free(pcVar6);
        }
        curl_slist_free_all(headers);
        iVar3 = 0xd;
        goto LAB_0010dd9b;
      }
      CVar5 = file_or_stdin(part,data);
      if ((CVar5 != CURLE_OK) &&
         (warnf(config->global,"setting file %s  failed!\n",pcVar7), CVar5 != CURLE_READ_ERROR)) {
        iVar3 = 0xe;
        if (pcVar6 != *local_68) {
          curl_mime_free(pcVar6);
        }
        goto LAB_0010dd9b;
      }
      if ((filename != (char *)0x0) && (iVar4 = curl_mime_filename(part), iVar4 != 0)) {
        warnf(config->global,"curl_mime_filename failed!\n");
        iVar3 = 0xf;
LAB_0010dd89:
        if (pcVar6 != *local_68) {
          curl_mime_free(pcVar6);
        }
        goto LAB_0010dd9b;
      }
      iVar4 = curl_mime_type(part,type);
      if (iVar4 != 0) {
        warnf(config->global,"curl_mime_type failed!\n");
        iVar3 = 0x10;
        goto LAB_0010dd89;
      }
      iVar4 = curl_mime_encoder(part,encoder);
      if (iVar4 != 0) {
        warnf(config->global,"curl_mime_encoder failed!\n");
        iVar3 = 0x11;
        goto LAB_0010dd89;
      }
    } while (iVar3 != 0);
    bVar2 = true;
    if (pcVar6 == *local_68) {
LAB_0010de55:
      iVar3 = 0;
      pcVar8 = local_40;
    }
    else {
      part = (curl_mimepart *)curl_mime_addpart();
      if (part == (curl_mimepart *)0x0) {
        part = (curl_mimepart *)0x0;
        warnf(config->global,"curl_mime_addpart failed!\n");
        curl_mime_free(pcVar6);
        iVar3 = 0x12;
      }
      else {
        iVar3 = curl_mime_subparts(part,pcVar6);
        if (iVar3 == 0) goto LAB_0010de55;
        warnf(config->global,"curl_mime_subparts failed!\n");
        curl_mime_free(pcVar6);
        iVar3 = 0x13;
      }
LAB_0010dd9b:
      free(local_78);
      local_78 = (char *)0x0;
      bVar2 = false;
      pcVar8 = local_40;
    }
  }
  if (!bVar2) {
    return iVar3;
  }
LAB_0010ddb7:
  if ((pcVar8 == (char *)0x0) || (iVar3 = curl_mime_name(part), iVar3 == 0)) {
    free(local_78);
    iVar3 = 0;
  }
  else {
    warnf(config->global,"curl_mime_name failed!\n");
    free(local_78);
    iVar3 = 0x1f;
  }
  return iVar3;
}

Assistant:

int formparse(struct OperationConfig *config,
              const char *input,
              curl_mime **mimepost,
              curl_mime **mimecurrent,
              bool literal_value)
{
  /* input MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char *name = NULL;
  char *contents = NULL;
  char *contp;
  char *data;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  struct curl_slist *headers = NULL;
  curl_mimepart *part = NULL;
  CURLcode res;
  int sep = '\0';

  /* Allocate the main mime structure if needed. */
  if(!*mimepost) {
    *mimepost = curl_mime_init(config->easy);
    if(!*mimepost) {
      warnf(config->global, "curl_mime_init failed!\n");
      return 1;
    }
    *mimecurrent = *mimepost;
  }

  /* Make a copy we can overwrite. */
  contents = strdup(input);
  if(!contents) {
    fprintf(config->global->errors, "out of memory\n");
    return 2;
  }

  /* Scan for the end of the name. */
  contp = strchr(contents, '=');
  if(contp) {
    if(contp > contents)
      name = contents;
    *contp++ = '\0';

    if(*contp == '(' && !literal_value) {
      curl_mime *subparts;

      /* Starting a multipart. */
      sep = get_param_part(config, '\0',
                           &contp, &data, &type, NULL, NULL, &headers);
      if(sep < 0) {
        Curl_safefree(contents);
        return 3;
      }
      subparts = curl_mime_init(config->easy);
      if(!subparts) {
        warnf(config->global, "curl_mime_init failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 4;
      }
      part = curl_mime_addpart(*mimecurrent);
      if(!part) {
        warnf(config->global, "curl_mime_addpart failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 5;
      }
      if(curl_mime_subparts(part, subparts)) {
        warnf(config->global, "curl_mime_subparts failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 6;
      }
      *mimecurrent = subparts;
      if(curl_mime_headers(part, headers, 1)) {
        warnf(config->global, "curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 7;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 8;
      }
    }
    else if(!name && !strcmp(contp, ")") && !literal_value) {
      /* Ending a mutipart. */
      if(*mimecurrent == *mimepost) {
        warnf(config->global, "no multipart to terminate!\n");
        Curl_safefree(contents);
        return 9;
        }
      *mimecurrent = (*mimecurrent)->parent->parent;
    }
    else if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      curl_mime *subparts = NULL;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        ++contp;
        sep = get_param_part(config, ',', &contp,
                             &data, &type, &filename, &encoder, &headers);
        if(sep < 0) {
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 10;
        }

        /* now contp point to comma or string end.
           If more files to come, make sure we have multiparts. */
        if(!subparts) {
          if(sep != ',')    /* If there is a single file. */
            subparts = *mimecurrent;
          else {
            subparts = curl_mime_init(config->easy);
            if(!subparts) {
              warnf(config->global, "curl_mime_init failed!\n");
              curl_slist_free_all(headers);
              Curl_safefree(contents);
              return 11;
            }
          }
        }

        /* Allocate a part for that file. */
        part = curl_mime_addpart(subparts);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 12;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 13;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s  failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            if(subparts != *mimecurrent)
              curl_mime_free(subparts);
            Curl_safefree(contents);
            return 14;
          }
        }
        if(filename && curl_mime_filename(part, filename)) {
          warnf(config->global, "curl_mime_filename failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 15;
        }
        if(curl_mime_type(part, type)) {
          warnf(config->global, "curl_mime_type failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 16;
        }
        if(curl_mime_encoder(part, encoder)) {
          warnf(config->global, "curl_mime_encoder failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 17;
        }

        /* *contp could be '\0', so we just check with the delimiter */
      } while(sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(subparts != *mimecurrent) {
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 18;
        }
        if(curl_mime_subparts(part, subparts)) {
          warnf(config->global, "curl_mime_subparts failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 19;
        }
      }
    }
    else {
        /* Allocate a mime part. */
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          Curl_safefree(contents);
          return 20;
        }

      if(*contp == '<' && !literal_value) {
        ++contp;
        sep = get_param_part(config, '\0', &contp,
                             &data, &type, NULL, &encoder, &headers);
        if(sep < 0) {
          Curl_safefree(contents);
          return 21;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 22;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            Curl_safefree(contents);
            return 23;
          }
        }
      }
      else {
        if(literal_value)
          data = contp;
        else {
          sep = get_param_part(config, '\0', &contp,
                               &data, &type, &filename, &encoder, &headers);
          if(sep < 0) {
            Curl_safefree(contents);
            return 24;
          }
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 25;
        }

#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(data, strlen(data))) {
          warnf(config->global, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 26;
        }
#endif

        if(curl_mime_data(part, data, CURL_ZERO_TERMINATED)) {
          warnf(config->global, "curl_mime_data failed!\n");
          Curl_safefree(contents);
          return 27;
        }
      }

      if(curl_mime_filename(part, filename)) {
        warnf(config->global, "curl_mime_filename failed!\n");
        Curl_safefree(contents);
        return 28;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 29;
      }
      if(curl_mime_encoder(part, encoder)) {
        warnf(config->global, "curl_mime_encoder failed!\n");
        Curl_safefree(contents);
        return 30;
      }

      if(sep) {
        *contp = (char) sep;
        warnf(config->global,
              "garbage at end of field specification: %s\n", contp);
      }
    }

    /* Set part name. */
    if(name && curl_mime_name(part, name)) {
      warnf(config->global, "curl_mime_name failed!\n");
      Curl_safefree(contents);
      return 31;
    }
  }
  else {
    warnf(config->global, "Illegally formatted input field!\n");
    Curl_safefree(contents);
    return 32;
  }
  Curl_safefree(contents);
  return 0;
}